

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParamGenerator<long> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ParamGenerator<long> PVar2;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_28;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_20;
  long local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  ValueArray<long,long,long,long,long,long,long>::MakeVector<long,0ul,1ul,2ul,3ul,4ul,5ul,6ul>
            (&local_28);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>
                    ((testing *)this,local_28,local_20);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_28._M_current != (long *)0x0) {
    operator_delete(local_28._M_current,local_18 - (long)local_28._M_current);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<long>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<long>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }